

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::Argument_Binding::SerializeWithCachedSizes
          (Argument_Binding *this,CodedOutputStream *output)

{
  uint32 uVar1;
  Value *value;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 1) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)(((this->binding_).value_)->super_MessageLite)._vptr_MessageLite,
               *(int *)&(((this->binding_).value_)->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                        .ptr_,SERIALIZE,"CoreML.Specification.MILSpec.Argument.Binding.name");
    if (this->_oneof_case_[0] == 1) {
      value = (this->binding_).value_;
    }
    else {
      value = (Value *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,(string *)value,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 2) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->binding_).value_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void Argument_Binding::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.Argument.Binding)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.Argument.Binding.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // .CoreML.Specification.MILSpec.Value value = 2;
  if (has_value()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *binding_.value_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.Argument.Binding)
}